

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_point_suite.cpp
# Opt level: O0

void find_array_boolean(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_2a8;
  undefined4 local_29c;
  iterator local_298;
  iterator local_280;
  difference_type local_268 [2];
  iterator local_258;
  iterator local_240;
  undefined1 local_228 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_1f8;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1f8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1c8,true);
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current.current = '\0';
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._9_3_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_198,
             (nullable *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_1f8;
  local_48._8_8_ = 9;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x9;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_2a8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_2a8 = local_2a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_2a8);
  } while (local_2a8 != &local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_240,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  std::
  partition_point<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
            (local_228,&local_240,&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_280,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_298,(iterator *)local_228);
  local_268[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_280,&local_298);
  local_29c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/partition_point_suite.cpp"
             ,0x122,"void find_array_boolean()",local_268,&local_29c);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_280);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void find_array_boolean()
{
    variable data = array::make({ false, true, null, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    auto where = std::partition_point(data.begin(), data.end(), is<boolean>());
    TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
}